

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmPolicies.cxx
# Opt level: O0

bool cmPolicies::ApplyPolicyVersion
               (cmMakefile *mf,uint majorVer,uint minorVer,uint patchVer,WarnCompat warnCompat)

{
  cmMakefile *pcVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  PolicyStatus PVar5;
  char *pcVar6;
  cmState *this;
  byte local_17a;
  allocator<char> local_129;
  string local_128;
  allocator<char> local_101;
  string local_100;
  cmValue local_e0;
  undefined4 local_d8;
  allocator<char> local_d1;
  string local_d0;
  PolicyStatus local_b0;
  value_type local_ac;
  PolicyStatus status;
  PolicyID pid;
  vector<cmPolicies::PolicyID,_std::allocator<cmPolicies::PolicyID>_> ancientPolicies;
  string local_88;
  byte local_51;
  undefined1 local_50 [40];
  WarnCompat local_28;
  uint local_24;
  WarnCompat warnCompat_local;
  uint patchVer_local;
  uint minorVer_local;
  uint majorVer_local;
  cmMakefile *mf_local;
  
  local_51 = 0;
  bVar3 = false;
  local_28 = warnCompat;
  local_24 = patchVer;
  warnCompat_local = minorVer;
  patchVer_local = majorVer;
  _minorVer_local = mf;
  if ((warnCompat == On) &&
     (((majorVer < 2 || ((majorVer == 2 && (minorVer < 8)))) ||
      ((bVar3 = false, majorVer == 2 &&
       ((bVar3 = false, minorVer == 8 && (bVar3 = false, patchVer < 0xc)))))))) {
    bVar3 = false;
    if ((majorVer == 2) && ((bVar3 = false, minorVer == 6 && (bVar3 = false, patchVer == 0)))) {
      cmMakefile::GetStateSnapshot((cmStateSnapshot *)(local_50 + 0x10),mf);
      bVar2 = cmStateSnapshot::CanPopPolicyScope((cmStateSnapshot *)(local_50 + 0x10));
      bVar3 = false;
      if (bVar2) {
        cmMakefile::GetBacktrace((cmMakefile *)local_50);
        local_51 = 1;
        cmConstStack<cmListFileContext,_cmListFileBacktrace>::Top
                  ((cmConstStack<cmListFileContext,_cmListFileBacktrace> *)local_50);
        pcVar6 = (char *)std::__cxx11::string::c_str();
        iVar4 = cmsys::SystemTools::Strucmp(pcVar6,"cmake_policy");
        bVar3 = iVar4 == 0;
      }
    }
    bVar3 = (bool)(bVar3 ^ 1);
  }
  if ((local_51 & 1) != 0) {
    cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)local_50);
  }
  pcVar1 = _minorVer_local;
  if (bVar3) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_88,
               "Compatibility with CMake < 2.8.12 will be removed from a future version of CMake.\nUpdate the VERSION argument <min> value or use a ...<max> suffix to tell CMake that the project does not need compatibility with older versions."
               ,(allocator<char> *)
                ((long)&ancientPolicies.
                        super__Vector_base<cmPolicies::PolicyID,_std::allocator<cmPolicies::PolicyID>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    cmMakefile::IssueMessage(pcVar1,DEPRECATION_WARNING,&local_88);
    std::__cxx11::string::~string((string *)&local_88);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&ancientPolicies.
                       super__Vector_base<cmPolicies::PolicyID,_std::allocator<cmPolicies::PolicyID>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  }
  std::vector<cmPolicies::PolicyID,_std::allocator<cmPolicies::PolicyID>_>::vector
            ((vector<cmPolicies::PolicyID,_std::allocator<cmPolicies::PolicyID>_> *)&status);
  local_ac = CMP0000;
  do {
    if (local_ac == CMPCOUNT) {
      bVar3 = std::vector<cmPolicies::PolicyID,_std::allocator<cmPolicies::PolicyID>_>::empty
                        ((vector<cmPolicies::PolicyID,_std::allocator<cmPolicies::PolicyID>_> *)
                         &status);
      if (bVar3) {
        mf_local._7_1_ = 1;
      }
      else {
        DiagnoseAncientPolicies
                  ((vector<cmPolicies::PolicyID,_std::allocator<cmPolicies::PolicyID>_> *)&status,
                   patchVer_local,warnCompat_local,local_24,_minorVer_local);
        cmSystemTools::SetFatalErrorOccurred();
        mf_local._7_1_ = 0;
      }
LAB_00449b0b:
      local_d8 = 1;
      std::vector<cmPolicies::PolicyID,_std::allocator<cmPolicies::PolicyID>_>::~vector
                ((vector<cmPolicies::PolicyID,_std::allocator<cmPolicies::PolicyID>_> *)&status);
      return (bool)(mf_local._7_1_ & 1);
    }
    bVar3 = isPolicyNewerThan(local_ac,patchVer_local,warnCompat_local,local_24);
    if (bVar3) {
      PVar5 = GetPolicyStatus(local_ac);
      pcVar1 = _minorVer_local;
      if (PVar5 == REQUIRED_ALWAYS) {
        std::vector<cmPolicies::PolicyID,_std::allocator<cmPolicies::PolicyID>_>::push_back
                  ((vector<cmPolicies::PolicyID,_std::allocator<cmPolicies::PolicyID>_> *)&status,
                   &local_ac);
      }
      else {
        local_b0 = WARN;
        pcVar6 = idToString(local_ac);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_d0,pcVar6,&local_d1);
        bVar3 = GetPolicyDefault(pcVar1,&local_d0,&local_b0);
        local_17a = 1;
        if (bVar3) {
          bVar3 = cmMakefile::SetPolicy(_minorVer_local,local_ac,local_b0);
          local_17a = bVar3 ^ 0xff;
        }
        std::__cxx11::string::~string((string *)&local_d0);
        std::allocator<char>::~allocator(&local_d1);
        if ((local_17a & 1) != 0) {
          mf_local._7_1_ = 0;
          goto LAB_00449b0b;
        }
        if ((local_ac == CMP0001) && ((local_b0 == WARN || (local_b0 == OLD)))) {
          this = cmMakefile::GetState(_minorVer_local);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_100,"CMAKE_BACKWARDS_COMPATIBILITY",&local_101);
          local_e0 = cmState::GetInitializedCacheValue(this,&local_100);
          bVar3 = cmValue::operator_cast_to_bool(&local_e0);
          std::__cxx11::string::~string((string *)&local_100);
          std::allocator<char>::~allocator(&local_101);
          pcVar1 = _minorVer_local;
          if (((bVar3 ^ 0xffU) & 1) != 0) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_128,"CMAKE_BACKWARDS_COMPATIBILITY",&local_129);
            cmMakefile::AddCacheDefinition
                      (pcVar1,&local_128,"2.4",
                       "For backwards compatibility, what version of CMake commands and syntax should this version of CMake try to support."
                       ,STRING,false);
            std::__cxx11::string::~string((string *)&local_128);
            std::allocator<char>::~allocator(&local_129);
          }
        }
      }
    }
    else {
      bVar3 = cmMakefile::SetPolicy(_minorVer_local,local_ac,NEW);
      if (!bVar3) {
        mf_local._7_1_ = 0;
        goto LAB_00449b0b;
      }
    }
    local_ac = local_ac + CMP0001;
  } while( true );
}

Assistant:

bool cmPolicies::ApplyPolicyVersion(cmMakefile* mf, unsigned int majorVer,
                                    unsigned int minorVer,
                                    unsigned int patchVer,
                                    WarnCompat warnCompat)
{
  // Warn about policy versions for which support will be removed.
  if (warnCompat == WarnCompat::On &&
      (majorVer < 2 || (majorVer == 2 && minorVer < 8) ||
       (majorVer == 2 && minorVer == 8 && patchVer < 12)) &&
      // Avoid warning on calls generated by install(EXPORT)
      // in CMake versions prior to 3.18.
      !(majorVer == 2 && minorVer == 6 && patchVer == 0 &&
        mf->GetStateSnapshot().CanPopPolicyScope() &&
        cmSystemTools::Strucmp(mf->GetBacktrace().Top().Name.c_str(),
                               "cmake_policy") == 0)) {
    mf->IssueMessage(
      MessageType::DEPRECATION_WARNING,
      "Compatibility with CMake < 2.8.12 will be removed from "
      "a future version of CMake.\n"
      "Update the VERSION argument <min> value or use a ...<max> suffix "
      "to tell CMake that the project does not need compatibility with "
      "older versions.");
  }

  // now loop over all the policies and set them as appropriate
  std::vector<cmPolicies::PolicyID> ancientPolicies;
  for (PolicyID pid = cmPolicies::CMP0000; pid != cmPolicies::CMPCOUNT;
       pid = static_cast<PolicyID>(pid + 1)) {
    if (isPolicyNewerThan(pid, majorVer, minorVer, patchVer)) {
      if (cmPolicies::GetPolicyStatus(pid) == cmPolicies::REQUIRED_ALWAYS) {
        ancientPolicies.push_back(pid);
      } else {
        cmPolicies::PolicyStatus status = cmPolicies::WARN;
        if (!GetPolicyDefault(mf, idToString(pid), &status) ||
            !mf->SetPolicy(pid, status)) {
          return false;
        }
        if (pid == cmPolicies::CMP0001 &&
            (status == cmPolicies::WARN || status == cmPolicies::OLD)) {
          if (!(mf->GetState()->GetInitializedCacheValue(
                "CMAKE_BACKWARDS_COMPATIBILITY"))) {
            // Set it to 2.4 because that is the last version where the
            // variable had meaning.
            mf->AddCacheDefinition(
              "CMAKE_BACKWARDS_COMPATIBILITY", "2.4",
              "For backwards compatibility, what version of CMake "
              "commands and "
              "syntax should this version of CMake try to support.",
              cmStateEnums::STRING);
          }
        }
      }
    } else {
      if (!mf->SetPolicy(pid, cmPolicies::NEW)) {
        return false;
      }
    }
  }

  // Make sure the project does not use any ancient policies.
  if (!ancientPolicies.empty()) {
    DiagnoseAncientPolicies(ancientPolicies, majorVer, minorVer, patchVer, mf);
    cmSystemTools::SetFatalErrorOccurred();
    return false;
  }

  return true;
}